

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::SystemTimingCheckSymbol::serializeTo
          (SystemTimingCheckSymbol *this,ASTSerializer *serializer)

{
  pointer pAVar1;
  size_t sVar2;
  size_t sVar3;
  array<char,_2UL> *desc;
  pointer paVar4;
  long lVar5;
  Arg *arg;
  pointer pAVar6;
  string_view name;
  string_view name_00;
  string_view value;
  
  sVar3 = strlen(*(char **)(toString(slang::ast::SystemTimingCheckKind)::strings +
                           (long)(int)this->timingCheckKind * 8));
  ASTSerializer::write(serializer,0xf,"timingCheckKind",sVar3);
  name._M_str = "arguments";
  name._M_len = 9;
  ASTSerializer::startArray(serializer,name);
  if (this->isResolved == false) {
    resolve(this);
  }
  sVar2 = (this->args)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    pAVar6 = (this->args)._M_ptr;
    pAVar1 = pAVar6 + sVar2;
    do {
      ASTSerializer::startObject(serializer);
      if (pAVar6->expr != (Expression *)0x0) {
        ASTSerializer::write(serializer,4,"expr",(size_t)pAVar6->expr);
      }
      if (pAVar6->condition != (Expression *)0x0) {
        ASTSerializer::write(serializer,9,"condition",(size_t)pAVar6->condition);
      }
      if ((long)(int)pAVar6->edge != 0) {
        sVar3 = strlen(*(char **)(toString(slang::ast::EdgeKind)::strings +
                                 (long)(int)pAVar6->edge * 8));
        ASTSerializer::write(serializer,4,"edge",sVar3);
      }
      if ((pAVar6->edgeDescriptors)._M_extent._M_extent_value != 0) {
        name_00._M_str = "edgeDescriptors";
        name_00._M_len = 0xf;
        ASTSerializer::startArray(serializer,name_00);
        sVar2 = (pAVar6->edgeDescriptors)._M_extent._M_extent_value;
        if (sVar2 != 0) {
          paVar4 = (pAVar6->edgeDescriptors)._M_ptr;
          lVar5 = sVar2 * 2;
          do {
            value._M_str = paVar4->_M_elems;
            value._M_len = 2;
            ASTSerializer::serialize(serializer,value);
            paVar4 = paVar4 + 1;
            lVar5 = lVar5 + -2;
          } while (lVar5 != 0);
        }
        ASTSerializer::endArray(serializer);
      }
      ASTSerializer::endObject(serializer);
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != pAVar1);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void SystemTimingCheckSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("timingCheckKind", toString(timingCheckKind));

    serializer.startArray("arguments");
    for (auto& arg : getArguments()) {
        serializer.startObject();
        if (arg.expr)
            serializer.write("expr", *arg.expr);
        if (arg.condition)
            serializer.write("condition", *arg.condition);
        if (arg.edge != EdgeKind::None)
            serializer.write("edge", toString(arg.edge));

        if (!arg.edgeDescriptors.empty()) {
            serializer.startArray("edgeDescriptors");
            for (auto& desc : arg.edgeDescriptors)
                serializer.serialize(std::string_view(desc.data(), desc.size()));
            serializer.endArray();
        }

        serializer.endObject();
    }
    serializer.endArray();
}